

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

uint16_t * __thiscall
duckdb_snappy::internal::WorkingMemory::GetHashTable
          (WorkingMemory *this,size_t fragment_size,int *table_size)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0x8000;
  uVar3 = (uint)fragment_size;
  if ((uVar3 < 0x8001) && (uVar2 = 0x100, 0xff < uVar3)) {
    iVar1 = 0x1f;
    if (uVar3 - 1 != 0) {
      for (; uVar3 - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar2 = 2 << ((byte)iVar1 & 0x1f);
  }
  switchD_01306cb1::default(this->table_,0,(ulong)uVar2 * 2);
  *table_size = uVar2;
  return this->table_;
}

Assistant:

uint16_t* WorkingMemory::GetHashTable(size_t fragment_size,
                                      int* table_size) const {
  const size_t htsize = CalculateTableSize(fragment_size);
  memset(table_, 0, htsize * sizeof(*table_));
  *table_size = htsize;
  return table_;
}